

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.h
# Opt level: O0

void __thiscall Clasp::Assignment::Assignment(Assignment *this)

{
  long in_RDI;
  ReasonStore64 *this_00;
  pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_> *in_stack_fffffffffffffff0;
  
  bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>::pod_vector
            (in_stack_fffffffffffffff0);
  *(undefined4 *)(in_RDI + 0x10) = 0;
  this_00 = (ReasonStore64 *)(in_RDI + 0x18);
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pod_vector
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffff0);
  ReasonStore64::ReasonStore64(this_00);
  bk_lib::pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_>::pod_vector
            ((pod_vector<Clasp::ValueSet,_std::allocator<Clasp::ValueSet>_> *)
             in_stack_fffffffffffffff0);
  *(undefined4 *)(in_RDI + 0x58) = 0;
  *(undefined4 *)(in_RDI + 0x5c) = 0;
  return;
}

Assistant:

Assignment() : front(0), elims_(0), units_(0) { }